

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_creator.cpp
# Opt level: O1

Graph * createPositiveTestGraph(void)

{
  pointer psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Head_base<0UL,_EdgeProperties_*,_false> _Var5;
  pointer extraout_RDX;
  _Head_base<0UL,_EdgeProperties_*,_false> _Var6;
  unique_ptr<EdgeProperties,_std::default_delete<EdgeProperties>_> *puVar7;
  long lVar8;
  Graph *in_RDI;
  long lVar9;
  AdjList *g;
  value_type vVar10;
  long lVar11;
  EdgeIterator ei;
  EdgeIterator ei_end;
  E edge_array [10];
  undefined8 uStack_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined1 uStack_1b8;
  undefined7 uStack_1b7;
  byte bStack_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  undefined8 local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  undefined1 uStack_168;
  ulong uStack_167;
  long local_158;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_128;
  undefined1 *local_98;
  undefined8 *local_90;
  pair<int,_int> local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  pair<int,_int> local_38;
  
  local_88.first = 0;
  local_88.second = 3;
  uStack_80 = 0x200000000;
  local_78 = 0x100000000;
  uStack_70 = 1;
  local_68 = 0x300000002;
  uStack_60 = 0x100000002;
  local_58 = 0x100000003;
  uStack_50 = 0x400000003;
  local_48 = 4;
  uStack_40 = 0x200000004;
  vVar10 = 0;
  boost::
  adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
  ::adjacency_list<std::pair<int,int>*>
            ((adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
              *)in_RDI,&local_88,&local_38,5,0,(no_property *)&local_128);
  uStack_1b8 = 0;
  uStack_1b7 = 0;
  bStack_1b0 = 0;
  uStack_1c8 = 0;
  local_1c0 = 0;
  uStack_1bf = 0;
  uStack_168 = 0;
  uStack_167 = 0;
  local_178 = 0;
  local_170 = 0;
  uStack_16f = 0;
  psVar1 = (pointer)(in_RDI->super_type).m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  _Var5._M_head_impl =
       (EdgeProperties *)
       (in_RDI->super_type).m_vertices.
       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_128.first.vEnd.m_value = (long)_Var5._M_head_impl - (long)psVar1 >> 5;
  if ((pointer)_Var5._M_head_impl == psVar1) {
    local_128.first.edges.super_type.m_initialized = false;
    _Var6._M_head_impl = (EdgeProperties *)extraout_RDX;
  }
  else {
    _Var5._M_head_impl = *(EdgeProperties **)&psVar1->super_stored_edge<unsigned_long>;
    _Var6._M_head_impl = *(EdgeProperties **)&psVar1->m_property;
    if (_Var6._M_head_impl == _Var5._M_head_impl) {
      puVar7 = (unique_ptr<EdgeProperties,_std::default_delete<EdgeProperties>_> *)
               ((long)(psVar1 + 2) + 8);
      vVar10 = 0;
      do {
        if (local_128.first.vEnd.m_value - 1 == vVar10) {
          local_128.first.edges.super_type.m_initialized = false;
          vVar10 = local_128.first.vEnd.m_value;
          goto LAB_0010dd5c;
        }
        _Var5._M_head_impl =
             (EdgeProperties *)
             (((stored_edge_property<unsigned_long,_EdgeProperties> *)(puVar7 + -1))->
             super_stored_edge<unsigned_long>).m_target;
        _Var6._M_head_impl = *(EdgeProperties **)&puVar7->_M_t;
        puVar7 = puVar7 + 4;
        vVar10 = vVar10 + 1;
      } while (_Var6._M_head_impl == _Var5._M_head_impl);
    }
    else {
      vVar10 = 0;
    }
    local_128.first.edges.super_type.m_initialized = true;
  }
LAB_0010dd5c:
  local_128.first.vBegin.m_value = 0;
  if (local_128.first.edges.super_type.m_initialized) {
    local_128.first.edges.super_type.m_storage.dummy_.aligner_ = (type)_Var5._M_head_impl;
    local_128.first.edges.super_type.m_storage.dummy_._8_8_ = vVar10;
    local_128.first.edges.super_type.m_storage.dummy_._16_8_ = _Var6._M_head_impl;
    local_128.first.edges.super_type.m_storage.dummy_._24_8_ = vVar10;
  }
  local_128.second.vBegin.m_value = 0;
  local_128.second.edges.super_type.m_initialized = false;
  local_90 = &local_178;
  local_128.first.vCurr.m_value = vVar10;
  local_128.second.vCurr.m_value = local_128.first.vEnd.m_value;
  local_128.second.vEnd.m_value = local_128.first.vEnd.m_value;
  local_98 = (undefined1 *)&uStack_1c8;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_98,&local_128);
  if (local_128.second.edges.super_type.m_initialized == true) {
    local_128.second.edges.super_type.m_initialized = false;
  }
  if (local_128.first.edges.super_type.m_initialized == true) {
    local_128.first.edges.super_type.m_initialized = false;
  }
  lVar8 = CONCAT71(uStack_1bf,local_1c0);
  lVar4 = CONCAT71(uStack_1b7,uStack_1b8);
  lVar9 = 0;
  do {
    if (lVar8 == CONCAT71(uStack_16f,local_170)) {
      if (lVar8 == lVar4) {
        return in_RDI;
      }
      if (((bStack_1b0 & 1) == 0) || ((uStack_167 & 0x100000000000000) == 0)) {
LAB_0010df1a:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                      "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                     );
      }
      if (local_1a8 == local_158) {
        return in_RDI;
      }
    }
    if ((bStack_1b0 & 1) == 0) goto LAB_0010df1a;
    **(undefined4 **)(local_1a8 + 8) = (&DAT_00116d90)[lVar9];
    local_1a8 = local_1a8 + 0x10;
    if (local_1a8 == local_198) {
      lVar11 = lVar8 * 0x20 + 0x28;
      do {
        if (lVar4 + -1 == lVar8) {
          local_1c0 = uStack_1b8;
          uStack_1bf = uStack_1b7;
          lVar8 = lVar4;
          goto LAB_0010dee5;
        }
        lVar2 = *(long *)(*(long *)(local_188 + 0x18) + -8 + lVar11);
        lVar3 = *(long *)(*(long *)(local_188 + 0x18) + lVar11);
        lVar11 = lVar11 + 0x20;
        lVar8 = lVar8 + 1;
      } while (lVar3 == lVar2);
      local_1c0 = (undefined1)lVar8;
      uStack_1bf = (undefined7)((ulong)lVar8 >> 8);
      local_1a8 = lVar2;
      local_1a0 = lVar8;
      local_198 = lVar3;
      local_190 = lVar8;
    }
LAB_0010dee5:
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

Graph createPositiveTestGraph()
{
    typedef std::pair < int, int >E;
    const int n_edges = 10;

    E edge_array[] = { E(0, 3), E(0, 2), E(0, 1), E(1, 0), E(2, 3), E(2, 1), E(3, 1), E(3, 4), E(4, 0), E(4,2) };
    int weight[n_edges] = { 4, 8, 5, 2, 9, 3, 7, 2, 6, 7 };

    Graph g(edge_array, edge_array + n_edges, 5);

    EdgeIterator ei, ei_end;
    int i = 0;
    for (tie(ei, ei_end) = edges(g); ei != ei_end; ++ei, ++i)
        g[*ei].weight = weight[i];

    return g;
}